

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlSearchNsByHref(xmlDocPtr doc,xmlNodePtr node,xmlChar *href)

{
  xmlElementType xVar1;
  xmlElementType xVar2;
  int iVar3;
  xmlNsPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *in_RCX;
  _xmlNode *node_00;
  
  if (node != (xmlNodePtr)0x0) {
    if (href == (xmlChar *)0x0) {
      return (xmlNsPtr)0x0;
    }
    if (node->type == XML_NAMESPACE_DECL) {
      return (xmlNsPtr)0x0;
    }
    iVar3 = xmlStrEqual(href,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
    if (iVar3 == 0) {
      xVar1 = node->type;
      for (node_00 = node; node_00 != (xmlNodePtr)0x0; node_00 = node_00->parent) {
        xVar2 = node_00->type;
        if (xVar2 == XML_ELEMENT_NODE) {
          pxVar4 = (xmlNsPtr)&node_00->nsDef;
          while (pxVar4 = pxVar4->next, pxVar4 != (xmlNsPtr)0x0) {
            if ((((pxVar4->href != (xmlChar *)0x0) &&
                 (iVar3 = xmlStrEqual(pxVar4->href,href), iVar3 != 0)) &&
                ((xVar1 != XML_ATTRIBUTE_NODE || ((xmlNodePtr)pxVar4->prefix != (xmlNodePtr)0x0))))
               && (iVar3 = xmlNsInScope((xmlDocPtr)node,node_00,(xmlNodePtr)pxVar4->prefix,in_RCX),
                  iVar3 == 1)) {
              return pxVar4;
            }
          }
          if ((((node_00 != node) && (pxVar4 = node_00->ns, pxVar4 != (xmlNsPtr)0x0)) &&
              (pxVar4->href != (xmlChar *)0x0)) &&
             (((iVar3 = xmlStrEqual(pxVar4->href,href), iVar3 != 0 &&
               ((xVar1 != XML_ATTRIBUTE_NODE || ((xmlNodePtr)pxVar4->prefix != (xmlNodePtr)0x0))))
              && (iVar3 = xmlNsInScope((xmlDocPtr)node,node_00,(xmlNodePtr)pxVar4->prefix,in_RCX),
                 iVar3 == 1)))) {
            return pxVar4;
          }
        }
        else {
          in_RCX = (xmlChar *)(ulong)(xVar2 - XML_ENTITY_REF_NODE);
          if (xVar2 - XML_ENTITY_REF_NODE < 2) {
            return (xmlNsPtr)0x0;
          }
          if (xVar2 == XML_ENTITY_DECL) {
            return (xmlNsPtr)0x0;
          }
        }
      }
    }
    else {
      if (doc != (xmlDocPtr)0x0) {
LAB_001818e8:
        if (doc->oldNs == (xmlNsPtr)0x0) {
          pxVar4 = xmlTreeEnsureXMLDecl(doc);
          return pxVar4;
        }
        return doc->oldNs;
      }
      if (node->type == XML_ELEMENT_NODE) {
        pxVar4 = (xmlNsPtr)(*xmlMalloc)(0x30);
        if (pxVar4 != (xmlNsPtr)0x0) {
          pxVar4->next = (_xmlNs *)0x0;
          *(undefined8 *)&pxVar4->type = 0;
          pxVar4->_private = (void *)0x0;
          pxVar4->context = (_xmlDoc *)0x0;
          pxVar4->href = (xmlChar *)0x0;
          pxVar4->prefix = (xmlChar *)0x0;
          pxVar4->type = XML_NAMESPACE_DECL;
          pxVar5 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
          pxVar4->href = pxVar5;
          pxVar5 = xmlStrdup("xml");
          pxVar4->prefix = pxVar5;
          pxVar4->next = node->nsDef;
          node->nsDef = pxVar4;
          return pxVar4;
        }
        xmlTreeErrMemory("searching namespace");
      }
      else {
        doc = node->doc;
        if (doc != (_xmlDoc *)0x0) goto LAB_001818e8;
      }
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlSearchNsByHref(xmlDocPtr doc, xmlNodePtr node, const xmlChar * href)
{
    xmlNsPtr cur;
    xmlNodePtr orig = node;
    int is_attr;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) || (href == NULL))
        return (NULL);
    if (xmlStrEqual(href, XML_XML_NAMESPACE)) {
        /*
         * Only the document can hold the XML spec namespace.
         */
        if ((doc == NULL) && (node->type == XML_ELEMENT_NODE)) {
            /*
             * The XML-1.0 namespace is normally held on the root
             * element. In this case exceptionally create it on the
             * node element.
             */
            cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
            if (cur == NULL) {
		xmlTreeErrMemory("searching namespace");
                return (NULL);
            }
            memset(cur, 0, sizeof(xmlNs));
            cur->type = XML_LOCAL_NAMESPACE;
            cur->href = xmlStrdup(XML_XML_NAMESPACE);
            cur->prefix = xmlStrdup((const xmlChar *) "xml");
            cur->next = node->nsDef;
            node->nsDef = cur;
            return (cur);
        }
	if (doc == NULL) {
	    doc = node->doc;
	    if (doc == NULL)
		return(NULL);
	}
	/*
	* Return the XML namespace declaration held by the doc.
	*/
	if (doc->oldNs == NULL)
	    return(xmlTreeEnsureXMLDecl(doc));
	else
	    return(doc->oldNs);
    }
    is_attr = (node->type == XML_ATTRIBUTE_NODE);
    while (node != NULL) {
        if ((node->type == XML_ENTITY_REF_NODE) ||
            (node->type == XML_ENTITY_NODE) ||
            (node->type == XML_ENTITY_DECL))
            return (NULL);
        if (node->type == XML_ELEMENT_NODE) {
            cur = node->nsDef;
            while (cur != NULL) {
                if ((cur->href != NULL) && (href != NULL) &&
                    (xmlStrEqual(cur->href, href))) {
		    if (((!is_attr) || (cur->prefix != NULL)) &&
		        (xmlNsInScope(doc, orig, node, cur->prefix) == 1))
			return (cur);
                }
                cur = cur->next;
            }
            if (orig != node) {
                cur = node->ns;
                if (cur != NULL) {
                    if ((cur->href != NULL) && (href != NULL) &&
                        (xmlStrEqual(cur->href, href))) {
			if (((!is_attr) || (cur->prefix != NULL)) &&
		            (xmlNsInScope(doc, orig, node, cur->prefix) == 1))
			    return (cur);
                    }
                }
            }
        }
        node = node->parent;
    }
    return (NULL);
}